

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O1

lzma_index * lzma_index_dup(lzma_index *src,lzma_allocator *allocator)

{
  lzma_vli lVar1;
  lzma_vli lVar2;
  index_tree_node *piVar3;
  lzma_vli lVar4;
  index_tree_node *piVar5;
  lzma_index *i;
  index_tree_node *node;
  index_tree_node *piVar6;
  index_tree_node *piVar7;
  index_tree_node *piVar8;
  index_tree_node *piVar9;
  lzma_vli lVar10;
  bool bVar11;
  
  i = (lzma_index *)lzma_alloc(0x50,allocator);
  if (i == (lzma_index *)0x0) {
LAB_004d0994:
    i = (lzma_index *)0x0;
  }
  else {
    *(undefined8 *)((long)&(i->streams).leftmost + 4) = 0;
    *(undefined8 *)((long)&(i->streams).rightmost + 4) = 0;
    (i->streams).root = (index_tree_node *)0x0;
    (i->streams).leftmost = (index_tree_node *)0x0;
    i->uncompressed_size = 0;
    i->total_size = 0;
    i->record_count = 0;
    i->index_list_size = 0;
    i->prealloc = 0x200;
    i->checks = 0;
    i->uncompressed_size = src->uncompressed_size;
    i->total_size = src->total_size;
    i->record_count = src->record_count;
    i->index_list_size = src->index_list_size;
    piVar7 = (src->streams).leftmost;
    do {
      if (piVar7[2].compressed_base < 0xffffffffffffffc) {
        lVar10 = piVar7->uncompressed_base;
        lVar1 = piVar7->compressed_base;
        lVar4 = piVar7[1].uncompressed_base;
        lVar2 = piVar7[1].compressed_base;
        node = (index_tree_node *)lzma_alloc(0xa8,allocator);
        if (node == (index_tree_node *)0x0) {
          node = (index_tree_node *)0x0;
        }
        else {
          node->uncompressed_base = lVar10;
          node->compressed_base = lVar1;
          node->parent = (index_tree_node *)0x0;
          node->left = (index_tree_node *)0x0;
          node->right = (index_tree_node *)0x0;
          *(int *)&node[1].uncompressed_base = (int)lVar4;
          node[1].compressed_base = lVar2;
          node[1].parent = (index_tree_node *)0x0;
          node[1].left = (index_tree_node *)0x0;
          *(undefined8 *)((long)&node[1].left + 4) = 0;
          *(undefined8 *)((long)&node[1].right + 4) = 0;
          node[2].compressed_base = 0;
          node[2].parent = (index_tree_node *)0x0;
          *(undefined4 *)&node[2].left = 0xffffffff;
          node[4].uncompressed_base = 0;
        }
        if (node == (index_tree_node *)0x0) goto LAB_004d0938;
        lVar10 = piVar7[2].compressed_base;
        node[2].compressed_base = lVar10;
        node[2].parent = piVar7[2].parent;
        piVar6 = piVar7[2].right;
        lVar1 = piVar7[3].uncompressed_base;
        lVar2 = piVar7[3].compressed_base;
        piVar9 = piVar7[3].parent;
        piVar3 = piVar7[3].left;
        node[2].left = piVar7[2].left;
        node[2].right = piVar6;
        node[3].uncompressed_base = lVar1;
        node[3].compressed_base = lVar2;
        node[3].parent = piVar9;
        node[3].left = piVar3;
        node[3].right = piVar7[3].right;
        node[4].uncompressed_base = piVar7[4].uncompressed_base;
        if (piVar7[1].left != (index_tree_node *)0x0) {
          piVar6 = (index_tree_node *)lzma_alloc(lVar10 * 0x10 + 0x40,allocator);
          if (piVar6 == (index_tree_node *)0x0) {
            index_stream_end(node,allocator);
            goto LAB_004d0938;
          }
          piVar6->uncompressed_base = 0;
          piVar6->compressed_base = 0;
          piVar6[1].uncompressed_base = 1;
          lVar10 = piVar7[2].compressed_base;
          piVar6[1].compressed_base = lVar10;
          piVar6[1].parent = (index_tree_node *)(lVar10 - 1);
          piVar9 = piVar7[1].left;
          lVar10 = 0;
          do {
            memcpy(&piVar6[1].left + lVar10 * 2,&piVar9[1].left,(long)piVar9[1].parent * 0x10 + 0x10
                  );
            piVar3 = piVar9 + 1;
            piVar5 = piVar9->right;
            piVar8 = piVar9;
            if (piVar9->right == (index_tree_node *)0x0) {
              do {
                piVar9 = piVar8->parent;
                if (piVar9 == (index_tree_node *)0x0) break;
                bVar11 = piVar9->right == piVar8;
                piVar8 = piVar9;
              } while (bVar11);
            }
            else {
              do {
                piVar9 = piVar5;
                piVar5 = piVar9->left;
              } while (piVar9->left != (index_tree_node *)0x0);
            }
            lVar10 = (long)&piVar3->parent->uncompressed_base + lVar10 + 1;
          } while (piVar9 != (index_tree_node *)0x0);
          if (lVar10 != piVar6[1].compressed_base) {
            __assert_fail("i == destg->allocated",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/common/index.c"
                          ,0x394,
                          "index_stream *index_dup_stream(const index_stream *, const lzma_allocator *)"
                         );
          }
          index_tree_append((index_tree *)&node[1].parent,piVar6);
        }
      }
      else {
LAB_004d0938:
        node = (index_tree_node *)0x0;
      }
      if (node == (index_tree_node *)0x0) {
        lzma_index_end(i,allocator);
      }
      else {
        index_tree_append((index_tree *)i,node);
        piVar6 = piVar7->right;
        piVar9 = piVar7;
        if (piVar7->right == (index_tree_node *)0x0) {
          do {
            piVar7 = piVar9->parent;
            if (piVar7 == (index_tree_node *)0x0) break;
            bVar11 = piVar7->right == piVar9;
            piVar9 = piVar7;
          } while (bVar11);
        }
        else {
          do {
            piVar7 = piVar6;
            piVar6 = piVar7->left;
          } while (piVar7->left != (index_tree_node *)0x0);
        }
      }
      if (node == (index_tree_node *)0x0) goto LAB_004d0994;
    } while (piVar7 != (index_tree_node *)0x0);
  }
  return i;
}

Assistant:

extern LZMA_API(lzma_index *)
lzma_index_dup(const lzma_index *src, const lzma_allocator *allocator)
{
	// Allocate the base structure (no initial Stream).
	lzma_index *dest = index_init_plain(allocator);
	if (dest == NULL)
		return NULL;

	// Copy the totals.
	dest->uncompressed_size = src->uncompressed_size;
	dest->total_size = src->total_size;
	dest->record_count = src->record_count;
	dest->index_list_size = src->index_list_size;

	// Copy the Streams and the groups in them.
	const index_stream *srcstream
			= (const index_stream *)(src->streams.leftmost);
	do {
		index_stream *deststream = index_dup_stream(
				srcstream, allocator);
		if (deststream == NULL) {
			lzma_index_end(dest, allocator);
			return NULL;
		}

		index_tree_append(&dest->streams, &deststream->node);

		srcstream = index_tree_next(&srcstream->node);
	} while (srcstream != NULL);

	return dest;
}